

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest5::logError
          (FunctionalTest5 *this,GLchar *(*subroutine_names) [2],GLuint *subroutine_combination,
          vec4<float> *input_data,vec4<float> *first_routine_result,
          vec4<float> *second_routine_result,vec4<float> *third_routine_result,
          vec4<unsigned_int> *fourth_routine_result,vec4<float> *first_routine_expected_result,
          vec4<float> *second_routine_expected_result,vec4<float> *third_routine_expected_result,
          vec4<unsigned_int> *fourth_routine_expected_result)

{
  TestContext *pTVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  MessageBuilder local_7c8;
  MessageBuilder local_648;
  MessageBuilder local_4c8;
  undefined1 local_348 [8];
  MessageBuilder message;
  MessageBuilder local_1b8;
  vec4<float> *local_38;
  vec4<float> *second_routine_result_local;
  vec4<float> *first_routine_result_local;
  vec4<float> *input_data_local;
  GLuint *subroutine_combination_local;
  GLchar *(*subroutine_names_local) [2];
  FunctionalTest5 *this_local;
  
  local_38 = second_routine_result;
  second_routine_result_local = first_routine_result;
  first_routine_result_local = input_data;
  input_data_local = (vec4<float> *)subroutine_combination;
  subroutine_combination_local = (GLuint *)subroutine_names;
  subroutine_names_local = (GLchar *(*) [2])this;
  pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_1b8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [23])"Error. Invalid result.");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_348,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [11])0x29be0ed);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char **)(subroutine_combination_local +
                                      (ulong)(uint)input_data_local->m_x * 2));
  tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b35bee);
  Utils::vec4<float>::log(first_routine_result_local,__x);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [3])0x2a4b1eb);
  Utils::vec4<float>::log(first_routine_result_local + 1,__x_00);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [13])" ). Result: ");
  Utils::vec4<float>::log(second_routine_result_local,__x_01);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [13])0x2b4545a);
  Utils::vec4<float>::log(first_routine_expected_result,__x_02);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_4c8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  tcu::MessageBuilder::operator=((MessageBuilder *)local_348,&local_4c8);
  tcu::MessageBuilder::~MessageBuilder(&local_4c8);
  pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [11])0x29be0ed);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char **)(subroutine_combination_local +
                                      (ulong)(uint)input_data_local->m_y * 2 + 4));
  tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b35bee);
  Utils::vec4<float>::log(first_routine_result_local,__x_03);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [13])" ). Result: ");
  Utils::vec4<float>::log(local_38,__x_04);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [13])0x2b4545a);
  Utils::vec4<float>::log(second_routine_expected_result,__x_05);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_648,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  tcu::MessageBuilder::operator=((MessageBuilder *)local_348,&local_648);
  tcu::MessageBuilder::~MessageBuilder(&local_648);
  pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [11])0x29be0ed);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char **)(subroutine_combination_local +
                                      (ulong)(uint)input_data_local->m_z * 2 + 8));
  tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b35bee);
  Utils::vec4<float>::log(first_routine_result_local,__x_06);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [3])0x2a4b1eb);
  Utils::vec4<float>::log(first_routine_result_local + 1,__x_07);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [3])0x2a4b1eb);
  Utils::vec4<float>::log(first_routine_result_local + 2,__x_08);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [12])0x2a1a403);
  Utils::vec4<float>::log(third_routine_result,__x_09);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [13])0x2b4545a);
  Utils::vec4<float>::log(third_routine_expected_result,__x_10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar2 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_7c8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  tcu::MessageBuilder::operator=((MessageBuilder *)local_348,&local_7c8);
  tcu::MessageBuilder::~MessageBuilder(&local_7c8);
  pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [11])0x29be0ed);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char **)(subroutine_combination_local +
                                      (ulong)(uint)input_data_local->m_w * 2 + 0xc));
  tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b35bee);
  Utils::vec4<float>::log(first_routine_result_local,__x_11);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [3])0x2a4b1eb);
  Utils::vec4<float>::log(first_routine_result_local + 1,__x_12);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [3])0x2a4b1eb);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [13])" ). Result: ");
  Utils::vec4<unsigned_int>::log(fourth_routine_result,__x_13);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_348,(char (*) [13])0x2b4545a);
  Utils::vec4<unsigned_int>::log(fourth_routine_expected_result,__x_14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_348);
  return;
}

Assistant:

void FunctionalTest5::logError(const glw::GLchar* subroutine_names[4][2], const glw::GLuint subroutine_combination[4],
							   const Utils::vec4<glw::GLfloat>  input_data[3],
							   const Utils::vec4<glw::GLfloat>& first_routine_result,
							   const Utils::vec4<glw::GLfloat>& second_routine_result,
							   const Utils::vec4<glw::GLfloat>& third_routine_result,
							   const Utils::vec4<glw::GLuint>&  fourth_routine_result,
							   const Utils::vec4<glw::GLfloat>& first_routine_expected_result,
							   const Utils::vec4<glw::GLfloat>& second_routine_expected_result,
							   const Utils::vec4<glw::GLfloat>& third_routine_expected_result,
							   const Utils::vec4<glw::GLuint>&  fourth_routine_expected_result) const
{
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
										<< tcu::TestLog::EndMessage;

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[0][subroutine_combination[0]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << " ). Result: ";
	first_routine_result.log(message);
	message << ". Expected: ";
	first_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[1][subroutine_combination[1]] << "( ";
	input_data[0].log(message);
	message << " ). Result: ";
	second_routine_result.log(message);
	message << ". Expected: ";
	second_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[2][subroutine_combination[2]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << ", ";
	input_data[2].log(message);
	message << "). Result: ";
	third_routine_result.log(message);
	message << ". Expected: ";
	third_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[3][subroutine_combination[3]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << ", ";
	message << " ). Result: ";
	fourth_routine_result.log(message);
	message << ". Expected: ";
	fourth_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;
}